

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::handleEncryptedRegion
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *skippedTokens,bool isSingleLine)

{
  SourceLocation location;
  Token token;
  Token local_38;
  
  ensureNoPragmaArgs(this,keyword,args);
  skipMacroTokensBeforeProtectRegion(this,keyword,skippedTokens);
  local_38 = Lexer::lexEncodedText
                       ((Lexer *)(this->lexerStack).
                                 super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                 .data_[(this->lexerStack).
                                        super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                        .len - 1]._M_t.
                                 super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                 .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,
                        this->protectEncoding,this->protectBytes,isSingleLine,false);
  location = Token::location(&local_38);
  addDiag(this,(DiagCode)0x280004,location);
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
            (skippedTokens,&local_38);
  return;
}

Assistant:

void Preprocessor::handleEncryptedRegion(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>& skippedTokens, bool isSingleLine) {
    ensureNoPragmaArgs(keyword, args);
    skipMacroTokensBeforeProtectRegion(keyword, skippedTokens);

    Token token = lexerStack.back()->lexEncodedText(protectEncoding, protectBytes, isSingleLine,
                                                    /* legacyProtectedMode */ false);
    addDiag(diag::ProtectedEnvelope, token.location());

    skippedTokens.push_back(token);
}